

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePooling3dLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  undefined4 uVar1;
  NeuralNetworkLayer *pNVar2;
  bool bVar3;
  int32 iVar4;
  Pooling3DLayerParams_Pooling3DPaddingType paddingType_00;
  Pooling3DLayerParams *from;
  allocator local_531;
  undefined1 local_530 [32];
  Result local_510;
  undefined1 local_4e0 [32];
  Result local_4c0;
  undefined1 local_490 [32];
  Result local_470;
  undefined1 local_440 [32];
  Result local_420;
  undefined1 local_3f0 [32];
  Result local_3d0;
  undefined1 local_3a0 [32];
  Result local_380;
  Pooling3DLayerParams_Pooling3DPaddingType paddingType;
  Result local_330;
  undefined1 local_300 [32];
  Result local_2e0;
  undefined1 local_2b0 [32];
  Result local_290;
  undefined1 local_260 [32];
  Result local_240;
  undefined1 local_210 [32];
  Result local_1f0;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [48];
  Pooling3DLayerParams pooling3d;
  undefined1 local_120 [32];
  Result local_100;
  undefined1 local_d0 [32];
  undefined1 local_b0 [40];
  Result local_88;
  Result local_50;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result_conflict *r;
  
  local_50.m_message._M_storage._M_storage[7] = '\0';
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result((Result *)__return_storage_ptr__);
  validateInputCount((Result_conflict *)&local_50,local_20,1,1);
  Result::operator=((Result *)__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar3 = Result::good((Result *)__return_storage_ptr__);
  if (bVar3) {
    validateOutputCount((Result_conflict *)(local_b0 + 0x28),local_20,1,1);
    Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_b0 + 0x28));
    Result::~Result((Result *)(local_b0 + 0x28));
    bVar3 = Result::good((Result *)__return_storage_ptr__);
    pNVar2 = local_20;
    if (bVar3) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_d0,"Pooling3d",
                   (allocator *)((long)local_100.m_message._M_storage._M_storage + 7));
        validateInputOutputRankEquality
                  ((Result_conflict *)local_b0,pNVar2,(string *)local_d0,&this->blobNameToRank);
        Result::operator=((Result *)__return_storage_ptr__,(Result *)local_b0);
        Result::~Result((Result *)local_b0);
        std::__cxx11::string::~string((string *)local_d0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)local_100.m_message._M_storage._M_storage + 7));
        bVar3 = Result::good((Result *)__return_storage_ptr__);
        pNVar2 = local_20;
        if (!bVar3) {
          local_50.m_message._M_storage._M_storage[7] = 1;
          local_88.m_message._M_storage._M_storage[0] = '\x01';
          local_88.m_message._M_storage._M_storage[1] = '\0';
          local_88.m_message._M_storage._M_storage[2] = '\0';
          local_88.m_message._M_storage._M_storage[3] = '\0';
          goto LAB_003fc631;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_120,"Pooling3d",(allocator *)((long)&pooling3d._cached_size_ + 3)
                  );
        validateRankCount((Result_conflict *)(local_120 + 0x20),pNVar2,(string *)local_120,5,-1,
                          &this->blobNameToRank);
        Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_120 + 0x20));
        Result::~Result((Result *)(local_120 + 0x20));
        std::__cxx11::string::~string((string *)local_120);
        std::allocator<char>::~allocator((allocator<char> *)((long)&pooling3d._cached_size_ + 3));
        bVar3 = Result::good((Result *)__return_storage_ptr__);
        if (!bVar3) {
          local_50.m_message._M_storage._M_storage[7] = 1;
          local_88.m_message._M_storage._M_storage[0] = '\x01';
          local_88.m_message._M_storage._M_storage[1] = '\0';
          local_88.m_message._M_storage._M_storage[2] = '\0';
          local_88.m_message._M_storage._M_storage[3] = '\0';
          goto LAB_003fc631;
        }
      }
      from = Specification::NeuralNetworkLayer::pooling3d(local_20);
      Specification::Pooling3DLayerParams::Pooling3DLayerParams
                ((Pooling3DLayerParams *)(local_1a0 + 0x28),from);
      iVar4 = Specification::Pooling3DLayerParams::kerneldepth
                        ((Pooling3DLayerParams *)(local_1a0 + 0x28));
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_1c0,"Kernel Depth",
                 (allocator *)((long)local_1f0.m_message._M_storage._M_storage + 7));
      validatePositive((Result_conflict *)local_1a0,iVar4,(string *)local_1c0);
      Result::operator=((Result *)__return_storage_ptr__,(Result *)local_1a0);
      Result::~Result((Result *)local_1a0);
      std::__cxx11::string::~string((string *)local_1c0);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)local_1f0.m_message._M_storage._M_storage + 7));
      bVar3 = Result::good((Result *)__return_storage_ptr__);
      if (bVar3) {
        iVar4 = Specification::Pooling3DLayerParams::kernelheight
                          ((Pooling3DLayerParams *)(local_1a0 + 0x28));
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_210,"Kernel Height",
                   (allocator *)((long)local_240.m_message._M_storage._M_storage + 7));
        validatePositive((Result_conflict *)(local_210 + 0x20),iVar4,(string *)local_210);
        Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_210 + 0x20));
        Result::~Result((Result *)(local_210 + 0x20));
        std::__cxx11::string::~string((string *)local_210);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)local_240.m_message._M_storage._M_storage + 7));
        bVar3 = Result::good((Result *)__return_storage_ptr__);
        if (bVar3) {
          iVar4 = Specification::Pooling3DLayerParams::kernelwidth
                            ((Pooling3DLayerParams *)(local_1a0 + 0x28));
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_260,"Kernel Width",
                     (allocator *)((long)local_290.m_message._M_storage._M_storage + 7));
          validatePositive((Result_conflict *)(local_260 + 0x20),iVar4,(string *)local_260);
          Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_260 + 0x20));
          Result::~Result((Result *)(local_260 + 0x20));
          std::__cxx11::string::~string((string *)local_260);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)local_290.m_message._M_storage._M_storage + 7));
          bVar3 = Result::good((Result *)__return_storage_ptr__);
          if (bVar3) {
            iVar4 = Specification::Pooling3DLayerParams::stridedepth
                              ((Pooling3DLayerParams *)(local_1a0 + 0x28));
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_2b0,"Stride Depth",
                       (allocator *)((long)local_2e0.m_message._M_storage._M_storage + 7));
            validatePositive((Result_conflict *)(local_2b0 + 0x20),iVar4,(string *)local_2b0);
            Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_2b0 + 0x20));
            Result::~Result((Result *)(local_2b0 + 0x20));
            std::__cxx11::string::~string((string *)local_2b0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)((long)local_2e0.m_message._M_storage._M_storage + 7));
            bVar3 = Result::good((Result *)__return_storage_ptr__);
            if (bVar3) {
              iVar4 = Specification::Pooling3DLayerParams::strideheight
                                ((Pooling3DLayerParams *)(local_1a0 + 0x28));
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)local_300,"Stride Height",
                         (allocator *)(local_330.m_message._M_storage._M_storage + 7));
              validatePositive((Result_conflict *)(local_300 + 0x20),iVar4,(string *)local_300);
              Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_300 + 0x20));
              Result::~Result((Result *)(local_300 + 0x20));
              std::__cxx11::string::~string((string *)local_300);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(local_330.m_message._M_storage._M_storage + 7));
              bVar3 = Result::good((Result *)__return_storage_ptr__);
              if (bVar3) {
                iVar4 = Specification::Pooling3DLayerParams::stridewidth
                                  ((Pooling3DLayerParams *)(local_1a0 + 0x28));
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&paddingType,"Stride Width",
                           (allocator *)((long)local_380.m_message._M_storage._M_storage + 7));
                validatePositive((Result_conflict *)&local_330,iVar4,(string *)&paddingType);
                Result::operator=((Result *)__return_storage_ptr__,&local_330);
                Result::~Result(&local_330);
                std::__cxx11::string::~string((string *)&paddingType);
                std::allocator<char>::~allocator
                          ((allocator<char> *)((long)local_380.m_message._M_storage._M_storage + 7))
                ;
                bVar3 = Result::good((Result *)__return_storage_ptr__);
                if (bVar3) {
                  paddingType_00 =
                       Specification::Pooling3DLayerParams::paddingtype
                                 ((Pooling3DLayerParams *)(local_1a0 + 0x28));
                  local_380.m_message._M_storage._M_storage._0_4_ = paddingType_00;
                  iVar4 = Specification::Pooling3DLayerParams::custompaddingfront
                                    ((Pooling3DLayerParams *)(local_1a0 + 0x28));
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)local_3a0,"Front",
                             (allocator *)((long)local_3d0.m_message._M_storage._M_storage + 7));
                  validatePooling3dPadding
                            ((Result_conflict *)(local_3a0 + 0x20),paddingType_00,iVar4,
                             (string *)local_3a0);
                  Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_3a0 + 0x20));
                  Result::~Result((Result *)(local_3a0 + 0x20));
                  std::__cxx11::string::~string((string *)local_3a0);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)local_3d0.m_message._M_storage._M_storage + 7));
                  bVar3 = Result::good((Result *)__return_storage_ptr__);
                  uVar1 = local_380.m_message._M_storage._M_storage._0_4_;
                  if (bVar3) {
                    iVar4 = Specification::Pooling3DLayerParams::custompaddingback
                                      ((Pooling3DLayerParams *)(local_1a0 + 0x28));
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)local_3f0,"Back",
                               (allocator *)((long)local_420.m_message._M_storage._M_storage + 7));
                    validatePooling3dPadding
                              ((Result_conflict *)(local_3f0 + 0x20),uVar1,iVar4,(string *)local_3f0
                              );
                    Result::operator=((Result *)__return_storage_ptr__,(Result *)(local_3f0 + 0x20))
                    ;
                    Result::~Result((Result *)(local_3f0 + 0x20));
                    std::__cxx11::string::~string((string *)local_3f0);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)
                               ((long)local_420.m_message._M_storage._M_storage + 7));
                    bVar3 = Result::good((Result *)__return_storage_ptr__);
                    uVar1 = local_380.m_message._M_storage._M_storage._0_4_;
                    if (bVar3) {
                      iVar4 = Specification::Pooling3DLayerParams::custompaddingtop
                                        ((Pooling3DLayerParams *)(local_1a0 + 0x28));
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)local_440,"Top",
                                 (allocator *)((long)local_470.m_message._M_storage._M_storage + 7))
                      ;
                      validatePooling3dPadding
                                ((Result_conflict *)(local_440 + 0x20),uVar1,iVar4,
                                 (string *)local_440);
                      Result::operator=((Result *)__return_storage_ptr__,
                                        (Result *)(local_440 + 0x20));
                      Result::~Result((Result *)(local_440 + 0x20));
                      std::__cxx11::string::~string((string *)local_440);
                      std::allocator<char>::~allocator
                                ((allocator<char> *)
                                 ((long)local_470.m_message._M_storage._M_storage + 7));
                      bVar3 = Result::good((Result *)__return_storage_ptr__);
                      uVar1 = local_380.m_message._M_storage._M_storage._0_4_;
                      if (bVar3) {
                        iVar4 = Specification::Pooling3DLayerParams::custompaddingbottom
                                          ((Pooling3DLayerParams *)(local_1a0 + 0x28));
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)local_490,"Bottom",
                                   (allocator *)
                                   ((long)local_4c0.m_message._M_storage._M_storage + 7));
                        validatePooling3dPadding
                                  ((Result_conflict *)(local_490 + 0x20),uVar1,iVar4,
                                   (string *)local_490);
                        Result::operator=((Result *)__return_storage_ptr__,
                                          (Result *)(local_490 + 0x20));
                        Result::~Result((Result *)(local_490 + 0x20));
                        std::__cxx11::string::~string((string *)local_490);
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)
                                   ((long)local_4c0.m_message._M_storage._M_storage + 7));
                        bVar3 = Result::good((Result *)__return_storage_ptr__);
                        uVar1 = local_380.m_message._M_storage._M_storage._0_4_;
                        if (bVar3) {
                          iVar4 = Specification::Pooling3DLayerParams::custompaddingleft
                                            ((Pooling3DLayerParams *)(local_1a0 + 0x28));
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)local_4e0,"Left",
                                     (allocator *)
                                     ((long)local_510.m_message._M_storage._M_storage + 7));
                          validatePooling3dPadding
                                    ((Result_conflict *)(local_4e0 + 0x20),uVar1,iVar4,
                                     (string *)local_4e0);
                          Result::operator=((Result *)__return_storage_ptr__,
                                            (Result *)(local_4e0 + 0x20));
                          Result::~Result((Result *)(local_4e0 + 0x20));
                          std::__cxx11::string::~string((string *)local_4e0);
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)
                                     ((long)local_510.m_message._M_storage._M_storage + 7));
                          bVar3 = Result::good((Result *)__return_storage_ptr__);
                          uVar1 = local_380.m_message._M_storage._M_storage._0_4_;
                          if (bVar3) {
                            iVar4 = Specification::Pooling3DLayerParams::custompaddingright
                                              ((Pooling3DLayerParams *)(local_1a0 + 0x28));
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string((string *)local_530,"Right",&local_531);
                            validatePooling3dPadding
                                      ((Result_conflict *)(local_530 + 0x20),uVar1,iVar4,
                                       (string *)local_530);
                            Result::operator=((Result *)__return_storage_ptr__,
                                              (Result *)(local_530 + 0x20));
                            Result::~Result((Result *)(local_530 + 0x20));
                            std::__cxx11::string::~string((string *)local_530);
                            std::allocator<char>::~allocator((allocator<char> *)&local_531);
                            Result::good((Result *)__return_storage_ptr__);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_50.m_message._M_storage._M_storage[7] = 1;
      local_88.m_message._M_storage._M_storage[0] = '\x01';
      local_88.m_message._M_storage._M_storage[1] = '\0';
      local_88.m_message._M_storage._M_storage[2] = '\0';
      local_88.m_message._M_storage._M_storage[3] = '\0';
      Specification::Pooling3DLayerParams::~Pooling3DLayerParams
                ((Pooling3DLayerParams *)(local_1a0 + 0x28));
    }
    else {
      local_50.m_message._M_storage._M_storage[7] = 1;
      local_88.m_message._M_storage._M_storage[0] = '\x01';
      local_88.m_message._M_storage._M_storage[1] = '\0';
      local_88.m_message._M_storage._M_storage[2] = '\0';
      local_88.m_message._M_storage._M_storage[3] = '\0';
    }
  }
  else {
    local_50.m_message._M_storage._M_storage[7] = 1;
    local_88.m_message._M_storage._M_storage[0] = '\x01';
    local_88.m_message._M_storage._M_storage[1] = '\0';
    local_88.m_message._M_storage._M_storage[2] = '\0';
    local_88.m_message._M_storage._M_storage[3] = '\0';
  }
LAB_003fc631:
  if ((local_50.m_message._M_storage._M_storage[7] & 1) == 0) {
    Result::~Result((Result *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePooling3dLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (!r.good()) { return r; }
    
    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) { return r; }
    
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Pooling3d", blobNameToRank);
        if (!r.good()) { return r; }
        // Rank 5 for 2 spacial dimensions, 1 temporal dimension, batch dimension, and 1+ channels.
        r = validateRankCount(layer, "Pooling3d", 5, -1, blobNameToRank);
        if (!r.good()) { return r; }
    }
    
    // Kernel
    const auto pooling3d = layer.pooling3d();
   
    r = validatePositive(pooling3d.kerneldepth(), "Kernel Depth");
    if (!r.good()) { return r; }

    r = validatePositive(pooling3d.kernelheight(), "Kernel Height");
    if (!r.good()) { return r; }

    r = validatePositive(pooling3d.kernelwidth(), "Kernel Width");
    if (!r.good()) { return r; }

    // Stride
    r = validatePositive(pooling3d.stridedepth(), "Stride Depth");
    if (!r.good()) { return r; }
    
    r = validatePositive(pooling3d.strideheight(), "Stride Height");
    if (!r.good()) { return r; }
    
    r = validatePositive(pooling3d.stridewidth(), "Stride Width");
    if (!r.good()) { return r; }
    
    // Custom Padding
    auto paddingType = pooling3d.paddingtype();
    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingfront(), "Front");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingback(), "Back");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingtop(), "Top");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingbottom(), "Bottom");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingleft(), "Left");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingright(), "Right");
    if (!r.good()) { return r; }
    
    return r;
}